

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

ImportSourcePtr createBaseModelImport(ModelPtr *importModel,string *resourcePath)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  string *psVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ImportSourcePtr IVar5;
  ParserPtr parser;
  long *local_68 [2];
  long local_58 [2];
  pointer local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Parser::create(SUB81(local_30,0));
  fileContents((string *)local_68);
  libcellml::Parser::parseModel((string *)&local_48);
  p_Var3 = p_Stack_40;
  pcVar2 = local_48;
  local_48 = (pointer)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)resourcePath->_M_string_length;
  (resourcePath->_M_dataplus)._M_p = pcVar2;
  resourcePath->_M_string_length = (size_type)p_Var3;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  libcellml::ImportSource::create();
  psVar1 = (string *)
           (importModel->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"I_am_a_url","");
  libcellml::ImportSource::setUrl(psVar1);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  libcellml::ImportSource::setModel
            ((shared_ptr *)
             (importModel->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  _Var4._M_pi = extraout_RDX;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    _Var4._M_pi = extraout_RDX_00;
  }
  IVar5.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  IVar5.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)importModel;
  return (ImportSourcePtr)
         IVar5.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ImportSourcePtr createBaseModelImport(libcellml::ModelPtr &importModel, const std::string &resourcePath)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();

    importModel = parser->parseModel(fileContents(resourcePath));

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");
    import->setModel(importModel);

    return import;
}